

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O0

void __thiscall SWDAnalyzer::~SWDAnalyzer(SWDAnalyzer *this)

{
  SWDAnalyzer *this_local;
  
  *(undefined ***)this = &PTR__SWDAnalyzer_00120c98;
  Analyzer::KillThread();
  SWDParser::~SWDParser(&this->mSWDParser);
  SWDSimulationDataGenerator::~SWDSimulationDataGenerator(&this->mSimulationDataGenerator);
  std::auto_ptr<SWDAnalyzerResults>::~auto_ptr(&this->mResults);
  SWDAnalyzerSettings::~SWDAnalyzerSettings(&this->mSettings);
  Analyzer2::~Analyzer2(&this->super_Analyzer2);
  return;
}

Assistant:

SWDAnalyzer::~SWDAnalyzer()
{
    KillThread();
}